

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O0

sc_signed * sc_dt::operator*(sc_unsigned *u,long v)

{
  small_type sVar1;
  undefined8 in_RDX;
  long in_RSI;
  sc_signed *in_RDI;
  int unaff_retaddr;
  sc_digit *in_stack_00000008;
  sc_digit vd [3];
  small_type s;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  sc_length_param *in_stack_ffffffffffffffb0;
  sc_digit *in_stack_ffffffffffffffb8;
  int ulen;
  sc_signed *psVar2;
  small_type us;
  int in_stack_ffffffffffffffd4;
  sc_digit *in_stack_ffffffffffffffd8;
  sc_length_param local_20;
  
  us = *(small_type *)(in_RSI + 8);
  psVar2 = in_RDI;
  sVar1 = get_sign<long>((long *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  ulen = (int)((ulong)in_RDI >> 0x20);
  sVar1 = mul_signs(us,sVar1);
  if (sVar1 == 0) {
    sc_length_param::sc_length_param(in_stack_ffffffffffffffb0);
    sc_length_param::len(&local_20);
    sc_signed::sc_signed
              ((sc_signed *)CONCAT44(in_stack_ffffffffffffffd4,us),(int)((ulong)psVar2 >> 0x20));
  }
  else {
    from_uint<unsigned_long>
              (ulen,in_stack_ffffffffffffffb8,(unsigned_long)in_stack_ffffffffffffffb0);
    mul_signed_friend((small_type)((ulong)in_RDX >> 0x20),(int)in_RDX,sVar1,
                      in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,unaff_retaddr,
                      in_stack_00000008);
  }
  return psVar2;
}

Assistant:

sc_signed
operator*(const sc_unsigned& u, long v)
{

  small_type s = mul_signs(u.sgn, get_sign(v));

  if (s == SC_ZERO) // case 1
    return sc_signed();

  CONVERT_LONG_2(v);

  // cases 2-4
  return mul_signed_friend(s, u.nbits, u.ndigits, u.digit,
                           BITS_PER_ULONG, DIGITS_PER_ULONG, vd);

}